

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O3

void nni_posix_pfd_stop(nni_posix_pfd *pfd)

{
  nni_posix_pollq *mtx;
  _Bool _Var1;
  int iVar2;
  ssize_t sVar3;
  undefined8 local_28;
  uint64_t one;
  
  mtx = pfd->pq;
  local_28 = 1;
  if (mtx != (nni_posix_pollq *)0x0) {
    _Var1 = nni_atomic_flag_test_and_set(&pfd->stopped);
    if (!_Var1) {
      nni_posix_pfd_close(pfd);
      _Var1 = nni_thr_is_self(&mtx->thr);
      if (_Var1) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_pollq_epoll.c"
                  ,0x95,"!nni_thr_is_self(&pq->thr)");
      }
      nni_mtx_lock(&mtx->mtx);
      if (mtx->close == false) {
        nni_list_append(&mtx->reapq,pfd);
        sVar3 = write(mtx->evfd,&local_28,8);
        if (sVar3 != 8) {
          nni_panic("BUG! write to epoll fd incorrect!");
        }
        iVar2 = nni_list_node_active(&pfd->node);
        if (iVar2 != 0) {
          do {
            nni_cv_wait(&mtx->cv);
            iVar2 = nni_list_node_active(&pfd->node);
          } while (iVar2 != 0);
        }
      }
      nni_mtx_unlock(&mtx->mtx);
      return;
    }
  }
  return;
}

Assistant:

void
nni_posix_pfd_stop(nni_posix_pfd *pfd)
{
	nni_posix_pollq *pq  = pfd->pq;
	uint64_t         one = 1;

	if (pq == NULL) {
		return;
	}
	if (nni_atomic_flag_test_and_set(&pfd->stopped)) {
		return;
	}

	nni_posix_pfd_close(pfd);

	// We have to synchronize with the pollq thread (unless we are
	// on that thread!)
	NNI_ASSERT(!nni_thr_is_self(&pq->thr));

	nni_mtx_lock(&pq->mtx);
	if (!pq->close) {
		nni_list_append(&pq->reapq, pfd);

		// Wake the remote side.  For now we assume this always
		// succeeds.  The only failure modes here occur when we
		// have already excessively signaled this (2^64 times
		// with no read!!), or when the evfd is closed, or some
		// kernel bug occurs.  Those errors would manifest as
		// a hang waiting for the poller to reap the pfd in fini,
		// if it were possible for them to occur.  (Barring other
		// bugs, it isn't.)
		if (write(pq->evfd, &one, sizeof(one)) != sizeof(one)) {
			nni_panic("BUG! write to epoll fd incorrect!");
		}

		while (nni_list_node_active(&pfd->node)) {
			nni_cv_wait(&pq->cv);
		}
	}
	nni_mtx_unlock(&pq->mtx);
}